

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::EndScalar(void)

{
  int iVar1;
  undefined8 in_stack_ffffffffffffff88;
  char ch;
  RegEx *in_stack_ffffffffffffff90;
  RegEx *in_stack_ffffffffffffffb0;
  RegEx *in_stack_ffffffffffffffb8;
  
  ch = (char)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  if (EndScalar()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&EndScalar()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(in_stack_ffffffffffffff90,ch);
      BlankOrBreak();
      RegEx::RegEx((RegEx *)0xf02ecf);
      operator|(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      YAML::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      RegEx::~RegEx((RegEx *)0xf02f08);
      RegEx::~RegEx((RegEx *)0xf02f12);
      RegEx::~RegEx((RegEx *)0xf02f1c);
      __cxa_atexit(RegEx::~RegEx,&EndScalar::e,&__dso_handle);
      __cxa_guard_release(&EndScalar()::e);
    }
  }
  return &EndScalar::e;
}

Assistant:

inline const RegEx& EndScalar() {
  static const RegEx e = RegEx(':') + (BlankOrBreak() | RegEx());
  return e;
}